

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_casting.hpp
# Opt level: O2

bool duckdb::CSVCast::TemplatedTryCastDecimalVector<duckdb::TryCastToDecimalCommaSeparated,int>
               (CSVReaderOptions *options,Vector *input_vector,Vector *result_vector,idx_t count,
               CastParameters *parameters,uint8_t width,uint8_t scale,idx_t *line_error)

{
  bool all_converted;
  uint8_t width_local;
  idx_t cur_line;
  CastParameters *local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  bool *local_50;
  idx_t *local_48;
  idx_t *local_40;
  ValidityMask *local_38;
  
  all_converted = true;
  width_local = width;
  FlatVector::VerifyFlatVector(result_vector);
  local_38 = &result_vector->validity;
  local_40 = &cur_line;
  cur_line = 0;
  local_58 = &scale;
  local_48 = line_error;
  local_68 = parameters;
  local_60 = &width_local;
  local_50 = &all_converted;
  UnaryExecutor::
  ExecuteStandard<duckdb::string_t,int,duckdb::UnaryLambdaWrapper,duckdb::CSVCast::TemplatedTryCastDecimalVector<duckdb::TryCastToDecimalCommaSeparated,int>(duckdb::CSVReaderOptions_const&,duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&,unsigned_char,unsigned_char,unsigned_long&)::_lambda(duckdb::string_t)_1_>
            (input_vector,result_vector,count,&local_68,false,CAN_THROW_RUNTIME_ERROR);
  return all_converted;
}

Assistant:

static bool TemplatedTryCastDecimalVector(const CSVReaderOptions &options, Vector &input_vector,
	                                          Vector &result_vector, idx_t count, CastParameters &parameters,
	                                          uint8_t width, uint8_t scale, idx_t &line_error) {
		D_ASSERT(input_vector.GetType().id() == LogicalTypeId::VARCHAR);
		bool all_converted = true;
		auto &validity_mask = FlatVector::Validity(result_vector);
		idx_t cur_line = 0;
		UnaryExecutor::Execute<string_t, T>(input_vector, result_vector, count, [&](string_t input) {
			T result;
			if (!OP::Operation(input, result, parameters, width, scale)) {
				if (all_converted) {
					line_error = cur_line;
				}
				validity_mask.SetInvalid(cur_line);
				all_converted = false;
				cur_line++;
			} else {
				cur_line++;
			}
			return result;
		});
		return all_converted;
	}